

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Errors.hpp
# Opt level: O2

void Diligent::
     LogError<true,char[29],char_const*,char[15],char[35],unsigned_int,char[15],char[23],unsigned_int,char[13],unsigned_int,char[72]>
               (bool IsFatal,char *Function,char *FullFilePath,int Line,char (*Args) [29],
               char **Args_1,char (*Args_2) [15],char (*Args_3) [35],uint *Args_4,
               char (*Args_5) [15],char (*Args_6) [23],uint *Args_7,char (*Args_8) [13],uint *Args_9
               ,char (*Args_10) [72])

{
  long lVar1;
  ostream *poVar2;
  char *pcVar3;
  char (*in_stack_ffffffffffffff88) [72];
  string Msg;
  string FileName;
  
  std::__cxx11::string::string((string *)&FileName,FullFilePath,(allocator *)&Msg);
  lVar1 = std::__cxx11::string::find_last_of((char *)&FileName,0x5ac3b1);
  if (lVar1 != -1) {
    std::__cxx11::string::erase((ulong)&FileName,0);
  }
  FormatString<char[29],char_const*,char[15],char[35],unsigned_int,char[15],char[23],unsigned_int,char[13],unsigned_int,char[72]>
            (&Msg,(Diligent *)Args,(char (*) [29])Args_1,(char **)Args_2,(char (*) [15])Args_3,
             (char (*) [35])Args_4,(uint *)Args_5,(char (*) [15])Args_6,(char (*) [23])Args_7,
             (uint *)Args_8,(char (*) [13])Args_9,(uint *)Args_10,in_stack_ffffffffffffff88);
  if (DebugMessageCallback == (undefined *)0x0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Diligent Engine: ");
    pcVar3 = "Error";
    if (IsFatal) {
      pcVar3 = "Fatal Error";
    }
    poVar2 = std::operator<<(poVar2,pcVar3);
    poVar2 = std::operator<<(poVar2," in ");
    poVar2 = std::operator<<(poVar2,Function);
    poVar2 = std::operator<<(poVar2,"() (");
    poVar2 = std::operator<<(poVar2,(string *)&FileName);
    poVar2 = std::operator<<(poVar2,", ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,Line);
    poVar2 = std::operator<<(poVar2,"): ");
    poVar2 = std::operator<<(poVar2,(string *)&Msg);
    std::operator<<(poVar2,'\n');
  }
  else {
    (*(code *)DebugMessageCallback)
              (IsFatal | 2,Msg._M_dataplus._M_p,Function,FileName._M_dataplus._M_p,Line);
  }
  ThrowIf<true>(&Msg);
  std::__cxx11::string::~string((string *)&Msg);
  std::__cxx11::string::~string((string *)&FileName);
  return;
}

Assistant:

void LogError(bool IsFatal, const char* Function, const char* FullFilePath, int Line, const ArgsType&... Args)
{
    std::string FileName(FullFilePath);

    auto LastSlashPos = FileName.find_last_of("/\\");
    if (LastSlashPos != std::string::npos)
        FileName.erase(0, LastSlashPos + 1);
    auto Msg = FormatString(Args...);
    if (DebugMessageCallback != nullptr)
    {
        DebugMessageCallback(IsFatal ? DEBUG_MESSAGE_SEVERITY_FATAL_ERROR : DEBUG_MESSAGE_SEVERITY_ERROR, Msg.c_str(), Function, FileName.c_str(), Line);
    }
    else
    {
        // No callback set - output to cerr
        std::cerr << "Diligent Engine: " << (IsFatal ? "Fatal Error" : "Error") << " in " << Function << "() (" << FileName << ", " << Line << "): " << Msg << '\n';
    }
    ThrowIf<bThrowException>(std::move(Msg));
}